

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

Fl_Tree_Item * __thiscall Fl_Tree::last_visible_item(Fl_Tree *this)

{
  Fl_Tree_Item *this_00;
  Fl_Tree_Item *pFVar1;
  
  this_00 = last(this);
  while( true ) {
    if (this_00 == (Fl_Tree_Item *)0x0) {
      return (Fl_Tree_Item *)0x0;
    }
    if (this_00->_visible != '\0') break;
    this_00 = Fl_Tree_Item::prev(this_00);
  }
  pFVar1 = (Fl_Tree_Item *)0x0;
  if ((this->_prefs)._showroot != '\0') {
    pFVar1 = this_00;
  }
  if (this_00 == this->_root) {
    return pFVar1;
  }
  return this_00;
}

Assistant:

Fl_Tree_Item* Fl_Tree::last_visible_item() {
  Fl_Tree_Item *item = last();
  while ( item ) {
    if ( item->visible() ) {
      if ( item == _root && !showroot() ) {
        return(0);
      } else {
        return(item);
      }
    }
    item = prev(item);
  }
  return(item);
}